

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLURL.cpp
# Opt level: O0

bool __thiscall xercesc_4_0::XMLURL::operator==(XMLURL *this,XMLURL *toCompare)

{
  bool bVar1;
  XMLCh *str1;
  XMLCh *str2;
  XMLURL *toCompare_local;
  XMLURL *this_local;
  
  str1 = getURLText(this);
  str2 = getURLText(toCompare);
  bVar1 = XMLString::equals(str1,str2);
  return bVar1;
}

Assistant:

bool XMLURL::operator==(const XMLURL& toCompare) const
{
    //
    //  Compare the two complete URLs (which have been processed the same
    //  way so they should now be the same even if they came in via different
    //  relative parts.
    //
    if (!XMLString::equals(getURLText(), toCompare.getURLText()))
        return false;

    return true;
}